

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_35::InMemoryDirectory::EntryImpl::init(EntryImpl *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 *in_RDX;
  Own<const_kj::Directory> *result;
  char *local_28;
  char *local_20;
  
  if (*(int *)(ctx + 0x18) != 0) {
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               *)(ctx + 0x18));
  }
  uVar1 = in_RDX[1];
  uVar2 = in_RDX[2];
  uVar3 = in_RDX[3];
  *(undefined4 *)(ctx + 0x20) = *in_RDX;
  *(undefined4 *)(ctx + 0x24) = uVar1;
  *(undefined4 *)(ctx + 0x28) = uVar2;
  *(undefined4 *)(ctx + 0x2c) = uVar3;
  *(undefined8 *)(in_RDX + 2) = 0;
  *(undefined4 *)(ctx + 0x18) = 2;
  (**(code **)(**(long **)(ctx + 0x28) + 0x28))(&local_28);
  (this->name).content.ptr = (char *)0x0;
  (this->name).content.size_ = 0;
  if (local_20 != (char *)0x0) {
    (this->name).content.size_ = (size_t)local_20;
    (this->name).content.ptr = local_28;
    local_20 = local_28;
  }
  return (int)local_20;
}

Assistant:

Own<const Directory> init(DirectoryNode&& value) {
      return node.init<DirectoryNode>(kj::mv(value)).directory->clone();
    }